

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_memory.cpp
# Opt level: O2

void * gim_alloc(size_t size)

{
  void *pvVar1;
  
  if (g_allocfn != (undefined1 *)0x0) {
    pvVar1 = (void *)(*(code *)g_allocfn)();
    return pvVar1;
  }
  pvVar1 = malloc(size);
  return pvVar1;
}

Assistant:

void * gim_alloc(size_t size)
{
	void * ptr;
	if (g_allocfn)
	{
		ptr = g_allocfn(size);
	}
	else
	{
#ifdef GIM_SIMD_MEMORY
		ptr = btAlignedAlloc(size,16);
#else
		ptr = malloc(size);
#endif
	}
  	return ptr;
}